

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter-base.hxx
# Opt level: O2

StateVector * __thiscall
stateObservation::compileTime::KalmanFilterBase<4U,_3U,_0U>::oneStepEstimation_
          (StateVector *__return_storage_ptr__,KalmanFilterBase<4U,_3U,_0U> *this)

{
  State *this_00;
  iterator *this_01;
  uint uVar1;
  uint k;
  size_type sVar2;
  reference pIVar3;
  long lVar4;
  long lVar5;
  MatrixT *pMVar6;
  MatrixT *pMVar7;
  MatrixT *pMVar8;
  Amatrix *pAVar9;
  Cmatrix *pCVar10;
  Pmatrix *pPVar11;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  **ppDVar12;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *pDVar13;
  char *__assertion;
  byte bVar14;
  StateVector xbar;
  MeasureVector ino;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *local_378;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_370;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_368;
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>,_0>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
  local_2f0 [8];
  PlainObjectBase<Eigen::Matrix<double,4,3,0,4,3>> *local_2e8;
  Cmatrix *local_2e0;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *local_2d0;
  Kmatrix kGain;
  Cmatrix c;
  Pmatrix pbar;
  Amatrix a;
  Rmatrix inoCov;
  Pmatrix px;
  
  bVar14 = 0;
  this_00 = &(this->super_ZeroDelayObserver<4U,_3U,_0U>).x_;
  IndexedMatrix<4U,_1U>::check_(this_00);
  uVar1 = (this->super_ZeroDelayObserver<4U,_3U,_0U>).x_.k_;
  sVar2 = std::
          deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
          ::size(&(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_);
  if (sVar2 != 0) {
    this_01 = &(this->super_ZeroDelayObserver<4U,_3U,_0U>).y_.
               super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
               ._M_impl.super__Deque_impl_data._M_start;
    pIVar3 = std::
             _Deque_iterator<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_stateObservation::compileTime::IndexedMatrix<3U,_1U>_&,_stateObservation::compileTime::IndexedMatrix<3U,_1U>_*>
             ::operator[](this_01,0);
    IndexedMatrix<3U,_1U>::check_(pIVar3);
    k = pIVar3->k_;
    if (k == uVar1 + 1) {
      if ((this->a_).isSet_ == false) {
        __assertion = "a_.isSet() && \"ERROR: The Matrix A is not initialized\"";
        uVar1 = 0x45;
      }
      else if ((this->c_).isSet_ == false) {
        __assertion = "c_.isSet() && \"ERROR: The Matrix C is not initialized\"";
        uVar1 = 0x46;
      }
      else if ((this->q_).isSet_ == false) {
        __assertion = "q_.isSet() && \"ERROR: The Matrix Q is not initialized\"";
        uVar1 = 0x47;
      }
      else if ((this->r_).isSet_ == false) {
        __assertion = "r_.isSet() && \"ERROR: The Matrix R is not initialized\"";
        uVar1 = 0x48;
      }
      else {
        if ((this->p_).isSet_ != false) {
          IndexedMatrix<4U,_4U>::check_(&this->a_);
          lVar5 = 0x10;
          pMVar7 = &(this->a_).v_;
          pAVar9 = &a;
          for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
            (pAVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0] = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                       m_storage.m_data.array[0];
            pMVar7 = (MatrixT *)((long)pMVar7 + (ulong)bVar14 * -0x10 + 8);
            pAVar9 = (Amatrix *)((long)pAVar9 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          IndexedMatrix<3U,_4U>::check_(&this->c_);
          pMVar6 = &(this->c_).v_;
          pCVar10 = &c;
          for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
            (pCVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data
            .array[0] = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                        m_storage.m_data.array[0];
            pMVar6 = (MatrixT *)((long)pMVar6 + (ulong)bVar14 * -0x10 + 8);
            pCVar10 = (Cmatrix *)((long)pCVar10 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          IndexedMatrix<4U,_4U>::check_(&this->p_);
          pMVar7 = &(this->p_).v_;
          pPVar11 = &px;
          for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
            (pPVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
            .array[0] = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                        m_storage.m_data.array[0];
            pMVar7 = (MatrixT *)((long)pMVar7 + (ulong)bVar14 * -0x10 + 8);
            pPVar11 = (Pmatrix *)((long)pPVar11 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>.
            _vptr_ObserverBase[0x17])(&xbar,this,(ulong)k);
          IndexedMatrix<4U,_4U>::check_(&this->q_);
          pMVar7 = &(this->q_).v_;
          ppDVar12 = &local_378;
          for (; lVar5 != 0; lVar5 = lVar5 + -1) {
            *ppDVar12 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                         *)(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                           m_storage.m_data.array[0];
            pMVar7 = (MatrixT *)((long)pMVar7 + (ulong)bVar14 * -0x10 + 8);
            ppDVar12 = ppDVar12 + (ulong)bVar14 * -2 + 1;
          }
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [0] = (double)&a;
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [1] = (double)&px;
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [2] = kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.
                array[0];
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [3] = (double)&local_378;
          Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
          _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>,0>const,Eigen::Matrix<double,4,4,0,4,4>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&pbar,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                      *)&kGain);
          pIVar3 = std::
                   _Deque_iterator<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_stateObservation::compileTime::IndexedMatrix<3U,_1U>_&,_stateObservation::compileTime::IndexedMatrix<3U,_1U>_*>
                   ::operator[](this_01,0);
          IndexedMatrix<3U,_1U>::check_(pIVar3);
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [2] = (pIVar3->v_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2];
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [0] = (pIVar3->v_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [1] = (pIVar3->v_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1];
          (*(this->super_ZeroDelayObserver<4U,_3U,_0U>).super_ObserverBase<4U,_3U,_0U>.
            _vptr_ObserverBase[0x18])
                    ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&inoCov,this,&xbar,(ulong)k
                    );
          local_378 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                       *)&kGain;
          local_370 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&inoCov;
          Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&ino,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)&local_378);
          IndexedMatrix<3U,_3U>::check_(&this->r_);
          pMVar8 = &(this->r_).v_;
          pDVar13 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)&local_378;
          for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
            *(double *)pDVar13 =
                 (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0];
            pMVar8 = (MatrixT *)((long)pMVar8 + (ulong)bVar14 * -0x10 + 8);
            pDVar13 = pDVar13 + (ulong)bVar14 * -0x10 + 8;
          }
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [0] = (double)&c;
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [1] = (double)&pbar;
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [2] = (double)&c;
          kGain.super_PlainObjectBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
          [3] = (double)&local_378;
          Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
          _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Transpose<Eigen::Matrix<double,3,4,0,3,4>>,0>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&inoCov,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_0>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&kGain);
          local_378 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                       *)&pbar;
          local_370 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&c;
          local_368 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&inoCov;
          Eigen::PlainObjectBase<Eigen::Matrix<double,4,3,0,4,3>>::
          _set_noalias<Eigen::Product<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Transpose<Eigen::Matrix<double,3,4,0,3,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,4,3,0,4,3>> *)&kGain,
                     (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
                      *)&local_378);
          local_378 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                       *)&xbar;
          local_368 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&ino;
          local_370 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&kGain;
          Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,4,1,0,4,1>const,Eigen::Product<Eigen::Matrix<double,4,3,0,4,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)__return_storage_ptr__,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)&local_378);
          IndexedMatrix<4U,_1U>::set(this_00,__return_storage_ptr__,k);
          Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
          local_2e8 = (PlainObjectBase<Eigen::Matrix<double,4,3,0,4,3>> *)&kGain;
          local_2e0 = &c;
          local_2d0 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                       *)&pbar;
          Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
          _set_noalias<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>const,Eigen::Product<Eigen::Matrix<double,4,3,0,4,3>,Eigen::Matrix<double,3,4,0,3,4>,0>const>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&local_378,local_2f0);
          IndexedMatrix<4U,_4U>::set(&this->p_,(MatrixT *)&local_378,k);
          return __return_storage_ptr__;
        }
        __assertion = "p_.isSet() && \"ERROR: The Matrix P is not initialized\"";
        uVar1 = 0x49;
      }
      goto LAB_00143a60;
    }
  }
  __assertion = 
  "this->y_.size()> 0 && this->y_[0].getTime()==k+1 && \"ERROR: The measurement vector is not set\""
  ;
  uVar1 = 0x41;
LAB_00143a60:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-kalman-filter-base.hxx"
                ,uVar1,
                "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::KalmanFilterBase<4, 3>::oneStepEstimation_() [n = 4, m = 3, p = 0]"
               );
}

Assistant:

typename ObserverBase<n,m,p>::StateVector KalmanFilterBase<n,m,p>::oneStepEstimation_()
{
    unsigned k=this->x_.getTime();
    BOOST_ASSERT(this->y_.size()> 0 && this->y_[0].getTime()==k+1 && "ERROR: The measurement vector is not set");
    if (p>0)
        BOOST_ASSERT(this->u_.size()> 0 && this->u_[0].getTime()==k && "ERROR: The input vector is not set");

    BOOST_ASSERT(a_.isSet() && "ERROR: The Matrix A is not initialized" );
    BOOST_ASSERT(c_.isSet() && "ERROR: The Matrix C is not initialized");
    BOOST_ASSERT(q_.isSet() && "ERROR: The Matrix Q is not initialized");
    BOOST_ASSERT(r_.isSet() && "ERROR: The Matrix R is not initialized");
    BOOST_ASSERT(p_.isSet() && "ERROR: The Matrix P is not initialized");

    Amatrix a=a_();
    Cmatrix c=c_();
    Pmatrix px=p_();

    //prediction
    typename ObserverBase<n,m,p>::StateVector xbar=prediction_(k+1);
    Pmatrix pbar=a*px*a.transpose()+q_();

    //innovation
    typename ObserverBase<n,m,p>::MeasureVector ino= this->y_[0]() - simulateSensor_(xbar,k+1);
    Rmatrix inoCov = c * pbar * c.transpose() + r_();

    //gain
    Kmatrix kGain ((pbar * c.transpose()) * inoCov.inverse());

    //update
    typename ObserverBase<n,m,p>::StateVector xhat=xbar+kGain*ino;

    this->x_.set(xhat,k+1);
    p_.set((Pmatrix::Identity()-kGain*c)*pbar,k+1);

    return xhat;
}